

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

string_view __thiscall absl::lts_20250127::Cord::FlattenSlowPath(Cord *this)

{
  bool bVar1;
  CordRepFlat *this_00;
  Nullable<absl::cord_internal::CordzInfo_*> info;
  Nonnull<absl::cord_internal::CordRep_*> rep;
  CordzUpdateScope local_70;
  CordzUpdateScope scope;
  string_view local_60 [2];
  new_allocator<char> local_39;
  char *local_38;
  char *new_buffer;
  CordRep *new_rep;
  size_t total_size;
  Cord *this_local;
  
  total_size = (size_t)this;
  bVar1 = InlineRep::is_tree(&this->contents_);
  if (!bVar1) {
    __assert_fail("contents_.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                  ,0x55d,"absl::string_view absl::Cord::FlattenSlowPath()");
  }
  new_rep = (CordRep *)size(this);
  if (new_rep < (CordRep *)0xff4) {
    new_buffer = (char *)cord_internal::CordRepFlat::New((size_t)new_rep);
    ((CordRep *)new_buffer)->length = (size_t)new_rep;
    this_00 = cord_internal::CordRep::flat((CordRep *)new_buffer);
    local_38 = cord_internal::CordRepFlat::Data(this_00);
    CopyToArraySlowPath(this,local_38);
  }
  else {
    std::allocator<char>::allocator();
    local_38 = __gnu_cxx::new_allocator<char>::allocate(&local_39,(size_type)new_rep,(void *)0x0);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    CopyToArraySlowPath(this,local_38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_60,local_38,(size_type)new_rep);
    new_buffer = (char *)cord_internal::
                         NewExternalRep<absl::lts_20250127::Cord::FlattenSlowPath()::__0>
                                   (local_60[0],(type *)((long)&scope.info_ + 7));
  }
  info = InlineRep::cordz_info(&this->contents_);
  cord_internal::CordzUpdateScope::CordzUpdateScope(&local_70,info,kFlatten);
  rep = InlineRep::as_tree(&this->contents_);
  cord_internal::CordRep::Unref(rep);
  InlineRep::SetTree(&this->contents_,(Nonnull<CordRep_*>)new_buffer,&local_70);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,local_38,
             (size_type)new_rep);
  cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_70);
  return _this_local;
}

Assistant:

absl::string_view Cord::FlattenSlowPath() {
  assert(contents_.is_tree());
  size_t total_size = size();
  CordRep* new_rep;
  char* new_buffer;

  // Try to put the contents into a new flat rep. If they won't fit in the
  // biggest possible flat node, use an external rep instead.
  if (total_size <= kMaxFlatLength) {
    new_rep = CordRepFlat::New(total_size);
    new_rep->length = total_size;
    new_buffer = new_rep->flat()->Data();
    CopyToArraySlowPath(new_buffer);
  } else {
    new_buffer = std::allocator<char>().allocate(total_size);
    CopyToArraySlowPath(new_buffer);
    new_rep = absl::cord_internal::NewExternalRep(
        absl::string_view(new_buffer, total_size), [](absl::string_view s) {
          std::allocator<char>().deallocate(const_cast<char*>(s.data()),
                                            s.size());
        });
  }
  CordzUpdateScope scope(contents_.cordz_info(), CordzUpdateTracker::kFlatten);
  CordRep::Unref(contents_.as_tree());
  contents_.SetTree(new_rep, scope);
  return absl::string_view(new_buffer, total_size);
}